

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

void ImGui::DebugNodeTableSettings(ImGuiTableSettings *settings)

{
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  char *pcVar4;
  byte *pbVar5;
  ulong uVar6;
  
  bVar1 = TreeNode((void *)(ulong)settings->ID,"Settings 0x%08X (%d columns)",
                   (void *)(ulong)settings->ID,(ulong)(uint)(int)settings->ColumnsCount);
  if (bVar1) {
    BulletText("SaveFlags: 0x%08X",(ulong)(uint)settings->SaveFlags);
    BulletText("ColumnsCount: %d (max %d)",(ulong)(uint)(int)settings->ColumnsCount,
               (ulong)(uint)(int)settings->ColumnsCountMax);
    if ('\0' < settings->ColumnsCount) {
      pbVar5 = (byte *)((long)&settings[1].RefScale + 3);
      uVar6 = 0;
      do {
        bVar2 = 0;
        if ((int)(char)pbVar5[-1] != 0xffffffff) {
          bVar2 = *pbVar5 & 3;
        }
        pcVar3 = "Des";
        if (bVar2 != 2) {
          pcVar3 = "---";
        }
        if (bVar2 == 1) {
          pcVar3 = "Asc";
        }
        pcVar4 = "Width ";
        if ((*pbVar5 & 8) != 0) {
          pcVar4 = "Weight";
        }
        BulletText("Column %d Order %d SortOrder %d %s Vis %d %s %7.3f UserID 0x%08X",
                   (double)*(float *)(pbVar5 + -0xb),uVar6 & 0xffffffff,
                   (ulong)(uint)(int)(char)pbVar5[-2],(ulong)(uint)(int)(char)pbVar5[-1],pcVar3,
                   (ulong)(*pbVar5 >> 2 & 1),pcVar4,(ulong)*(uint *)(pbVar5 + -7));
        uVar6 = uVar6 + 1;
        pbVar5 = pbVar5 + 0xc;
      } while ((long)uVar6 < (long)settings->ColumnsCount);
    }
    TreePop();
    return;
  }
  return;
}

Assistant:

void ImGui::DebugNodeTableSettings(ImGuiTableSettings* settings)
{
    if (!TreeNode((void*)(intptr_t)settings->ID, "Settings 0x%08X (%d columns)", settings->ID, settings->ColumnsCount))
        return;
    BulletText("SaveFlags: 0x%08X", settings->SaveFlags);
    BulletText("ColumnsCount: %d (max %d)", settings->ColumnsCount, settings->ColumnsCountMax);
    for (int n = 0; n < settings->ColumnsCount; n++)
    {
        ImGuiTableColumnSettings* column_settings = &settings->GetColumnSettings()[n];
        ImGuiSortDirection sort_dir = (column_settings->SortOrder != -1) ? (ImGuiSortDirection)column_settings->SortDirection : ImGuiSortDirection_None;
        BulletText("Column %d Order %d SortOrder %d %s Vis %d %s %7.3f UserID 0x%08X",
            n, column_settings->DisplayOrder, column_settings->SortOrder,
            (sort_dir == ImGuiSortDirection_Ascending) ? "Asc" : (sort_dir == ImGuiSortDirection_Descending) ? "Des" : "---",
            column_settings->IsEnabled, column_settings->IsStretch ? "Weight" : "Width ", column_settings->WidthOrWeight, column_settings->UserID);
    }
    TreePop();
}